

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SList.h
# Opt level: O2

void __thiscall
SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount>::Reverse
          (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *this)

{
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar1;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *pSVar3;
  
  pSVar2 = this;
  pSVar3 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
           (this->super_SListNodeBase<Memory::ArenaAllocator>).next;
  while (pSVar3 != this) {
    pSVar1 = (SListBase<FlowEdge_*,_Memory::ArenaAllocator,_RealCount> *)
             (pSVar3->super_SListNodeBase<Memory::ArenaAllocator>).next;
    (pSVar3->super_SListNodeBase<Memory::ArenaAllocator>).next =
         &pSVar2->super_SListNodeBase<Memory::ArenaAllocator>;
    pSVar2 = pSVar3;
    pSVar3 = pSVar1;
  }
  (pSVar3->super_SListNodeBase<Memory::ArenaAllocator>).next =
       &pSVar2->super_SListNodeBase<Memory::ArenaAllocator>;
  return;
}

Assistant:

void Reverse()
    {
        NodeBase * prev = this;
        NodeBase * current = this->Next();
        while (!this->IsHead(current))
        {
            NodeBase * next = current->Next();
            current->Next() = prev;
            prev = current;
            current = next;
        }
        current->Next() = prev;
    }